

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TessCoordComponentInvarianceCase::iterate
          (TessCoordComponentInvarianceCase *this)

{
  RenderContext *pRVar1;
  pointer pVVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int i;
  ulong uVar5;
  VertexArrayBinding *in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  pointer pfVar11;
  bool bVar12;
  bool bVar13;
  float fVar14;
  vector<float,_std::allocator<float>_> tessLevels;
  RandomViewport viewport;
  Result tfResult;
  VertexArrayBinding bindings [1];
  TFHandler tfHandler;
  ostringstream s;
  Random rnd;
  vector<float,_std::allocator<float>_> local_468;
  deUint32 local_444;
  TestLog *local_440;
  Vector<float,_3> *local_438;
  long *local_430;
  long local_428;
  long local_420 [2];
  RandomViewport local_410;
  Result local_400;
  long local_3e0;
  long local_3d8;
  Vector<float,_2> local_3d0;
  undefined1 local_3c8 [8];
  _Alloc_hider local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  int local_3a0;
  undefined1 local_398 [16];
  int local_388;
  pointer local_380;
  TransformFeedbackHandler<tcu::Vector<float,_3>_> local_378;
  string local_328 [3];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  long local_1a0;
  _func_int *local_198 [2];
  int local_188;
  ios_base local_138 [264];
  
  local_440 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar3 = (*pRVar1->_vptr_RenderContext[4])(pRVar1);
  dVar4 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_410,(RenderTarget *)CONCAT44(extraout_var,iVar3),0x10,0x10,dVar4);
  iVar3 = (*pRVar1->_vptr_RenderContext[3])(pRVar1);
  lVar10 = CONCAT44(extraout_var_00,iVar3);
  deRandom_init((deRandom *)local_1b0,0x7b);
  local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  iVar3 = 0;
  do {
    iVar9 = 6;
    do {
      fVar14 = deRandom_getFloat((deRandom *)local_1b0);
      fVar14 = fVar14 * 62.0 + 1.0;
      local_328[0]._M_dataplus._M_p._0_4_ = fVar14;
      if (local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (&local_468,
                   (iterator)
                   local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,(float *)local_328);
      }
      else {
        *local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_finish = fVar14;
        local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0x20);
  local_444 = (((this->m_program).m_ptr)->m_program).m_program;
  (**(code **)(lVar10 + 0x1680))();
  (**(code **)(lVar10 + 0x1a00))(local_410.x,local_410.y,local_410.width,local_410.height);
  (**(code **)(lVar10 + 0xfd8))(0x8e72,6);
  iVar3 = 0;
  lVar10 = 8;
  do {
    iVar9 = referenceVertexCount
                      (this->m_primitiveType,this->m_spacing,this->m_usePointMode,
                       (float *)((long)local_468.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar10 + -8),
                       (float *)((long)local_468.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar10));
    if (iVar3 <= iVar9) {
      iVar3 = iVar9;
    }
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x308);
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::TransformFeedbackHandler
            (&local_378,((this->super_TestCase).m_context)->m_renderCtx,iVar3);
  lVar10 = 0;
  do {
    iVar3 = (int)in_R9;
    paVar6 = &local_328[0].field_2;
    local_1b0 = (undefined1  [8])local_440;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Testing with tessellation levels: ",0x22);
    Functional::(anonymous_namespace)::tessellationLevelsString_abi_cxx11_
              (local_328,
               (_anonymous_namespace_ *)
               (local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start + lVar10 * 6),(float *)0x2,
               (int)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start + (int)lVar10 * 0x18 + 8,(float *)&DAT_00000004
               ,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,local_328[0]._M_dataplus._M_p,local_328[0]._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328[0]._M_dataplus._M_p != paVar6) {
      operator_delete(local_328[0]._M_dataplus._M_p,local_328[0].field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    local_328[0]._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"in_v_attr","");
    pfVar11 = local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start + lVar10 * 6;
    local_1b0._0_4_ = 1;
    local_1a8 = local_198;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a8,local_328[0]._M_dataplus._M_p,
               local_328[0]._M_dataplus._M_p + local_328[0]._M_string_length);
    local_188 = 0;
    local_3c8._0_4_ = local_1b0._0_4_;
    local_3c0._M_p = (pointer)&local_3b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3c0,local_1a8,local_1a0 + (long)local_1a8);
    local_3a0 = local_188;
    local_398._0_4_ = VTX_COMP_FLOAT;
    local_398._4_4_ = VTX_COMP_CONVERT_NONE;
    local_398._8_8_ = &DAT_600000001;
    local_388 = 0;
    local_380 = pfVar11;
    if (local_1a8 != local_198) {
      operator_delete(local_1a8,(ulong)(local_198[0] + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328[0]._M_dataplus._M_p != paVar6) {
      operator_delete(local_328[0]._M_dataplus._M_p,local_328[0].field_2._M_allocated_capacity + 1);
    }
    dVar4 = 0;
    if (this->m_usePointMode == false) {
      dVar4 = 0xffffffff;
      if ((ulong)this->m_primitiveType < 3) {
        dVar4 = *(deUint32 *)(&DAT_01c7c8e0 + (ulong)this->m_primitiveType * 4);
      }
    }
    in_R9 = (VertexArrayBinding *)local_3c8;
    TransformFeedbackHandler<tcu::Vector<float,_3>_>::renderAndGetPrimitives
              (&local_400,&local_378,local_444,dVar4,1,in_R9,6);
    local_3e0 = lVar10;
    if ((int)((ulong)((long)local_400.varying.
                            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_400.varying.
                           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555 < 1) {
      bVar13 = true;
    }
    else {
      lVar10 = 0;
      lVar8 = 0;
      do {
        pVVar2 = local_400.varying.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_438 = local_400.varying.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar8;
        uVar5 = (ulong)((this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) + 2);
        bVar12 = true;
        uVar7 = 1;
        local_3d8 = lVar10;
        do {
          iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                            (*(undefined4 *)((long)pVVar2->m_data + uVar7 * 4 + lVar10 + -4),this);
          if ((char)iVar3 == '\0') {
            local_1b0 = (undefined1  [8])local_440;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"Note: output value at index ",0x1c);
            std::ostream::operator<<((ostringstream *)&local_1a8,(int)lVar8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," is ",4);
            if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
              tcu::operator<<((ostream *)local_328,local_438);
              std::__cxx11::stringbuf::str();
            }
            else {
              local_3d0.m_data = *(float (*) [2])local_438->m_data;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
              tcu::operator<<((ostream *)local_328,&local_3d0);
              std::__cxx11::stringbuf::str();
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
            std::ios_base::~ios_base(local_2b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,(char *)local_430,local_428);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            if (local_430 != local_420) {
              operator_delete(local_430,local_420[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
            std::ios_base::~ios_base(local_138);
            bVar13 = true;
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Invalid tessellation coordinate component");
            goto LAB_0144ae6e;
          }
          bVar12 = uVar7 < uVar5;
          bVar13 = uVar7 != uVar5;
          uVar7 = uVar7 + 1;
        } while (bVar13);
        bVar13 = false;
LAB_0144ae6e:
        if (bVar12) goto LAB_0144aeb0;
        lVar8 = lVar8 + 1;
        lVar10 = local_3d8 + 0xc;
      } while (lVar8 < (int)((ulong)((long)local_400.varying.
                                           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_400.varying.
                                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                       -0x55555555);
      bVar13 = false;
LAB_0144aeb0:
      bVar13 = !bVar13;
    }
    if (local_400.varying.
        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_400.varying.
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_400.varying.
                            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_400.varying.
                            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_p != &local_3b0) {
      operator_delete(local_3c0._M_p,local_3b0._M_allocated_capacity + 1);
    }
    if (!bVar13) {
      glu::ObjectWrapper::~ObjectWrapper(&local_378.m_tfPrimQuery.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&local_378.m_tfBuffer.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&local_378.m_tf.super_ObjectWrapper);
      goto LAB_0144af93;
    }
    lVar10 = local_3e0 + 1;
    if (lVar10 == 0x20) {
      glu::ObjectWrapper::~ObjectWrapper(&local_378.m_tfPrimQuery.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&local_378.m_tfBuffer.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&local_378.m_tf.super_ObjectWrapper);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
LAB_0144af93:
      if (local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return STOP;
    }
  } while( true );
}

Assistant:

TessCoordComponentInvarianceCase::IterateResult TessCoordComponentInvarianceCase::iterate (void)
{
	typedef TransformFeedbackHandler<Vec3> TFHandler;

	TestLog&				log					= m_testCtx.getLog();
	const RenderContext&	renderCtx			= m_context.getRenderContext();
	const RandomViewport	viewport			(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&	gl					= renderCtx.getFunctions();
	const int				numTessLevelCases	= 32;
	const vector<float>		tessLevels			= genTessLevelCases(numTessLevelCases);
	const deUint32			programGL			= m_program->getProgram();

	gl.useProgram(programGL);
	setViewport(gl, viewport);
	gl.patchParameteri(GL_PATCH_VERTICES, 6);

	{
		// Compute the number vertices in the largest draw call, so we can allocate the TF buffer just once.
		int maxNumVerticesInDrawCall = 0;
		for (int i = 0; i < numTessLevelCases; i++)
			maxNumVerticesInDrawCall = de::max(maxNumVerticesInDrawCall, referenceVertexCount(m_primitiveType, m_spacing, m_usePointMode, &tessLevels[6*i+0], &tessLevels[6*i+2]));

		{
			const TFHandler tfHandler(m_context.getRenderContext(), maxNumVerticesInDrawCall);

			for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < numTessLevelCases; tessLevelCaseNdx++)
			{
				log << TestLog::Message << "Testing with tessellation levels: " << tessellationLevelsString(&tessLevels[6*tessLevelCaseNdx+0], &tessLevels[6*tessLevelCaseNdx+2]) << TestLog::EndMessage;

				const glu::VertexArrayBinding bindings[] = { glu::va::Float("in_v_attr", 1, (int)6, 0, &tessLevels[6*tessLevelCaseNdx]) };
				const TFHandler::Result tfResult = tfHandler.renderAndGetPrimitives(programGL, outputPrimitiveTypeGL(m_primitiveType, m_usePointMode),
																					DE_LENGTH_OF_ARRAY(bindings), &bindings[0], 6);

				for (int vtxNdx = 0; vtxNdx < (int)tfResult.varying.size(); vtxNdx++)
				{
					const Vec3&		vec			= tfResult.varying[vtxNdx];
					const int		numComps	= m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3 : 2;

					for (int compNdx = 0; compNdx < numComps; compNdx++)
					{
						if (!checkTessCoordComponent(vec[compNdx]))
						{
							log << TestLog::Message << "Note: output value at index " << vtxNdx << " is "
													<< (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? de::toString(vec) : de::toString(vec.swizzle(0,1)))
													<< TestLog::EndMessage;
							m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid tessellation coordinate component");
							return STOP;
						}
					}
				}
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}